

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O1

void __thiscall
cmCPackLog::Log(cmCPackLog *this,int tag,char *file,int line,char *msg,size_t length)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  size_t sVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  size_type sVar9;
  byte bVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  string tagString;
  byte local_79;
  char *local_68;
  char *local_60;
  char local_58;
  undefined7 uStack_57;
  char *local_48;
  size_t local_40;
  char *local_38;
  
  cVar3 = this->Debug;
  local_68 = &local_58;
  local_60 = (char *)0x0;
  local_58 = '\0';
  bVar12 = this->LogOutput != (ostream *)0x0;
  bVar13 = this->LastTag != tag;
  local_48 = msg;
  local_40 = length;
  local_38 = file;
  if ((tag & 1U) != 0 && (bVar13 && bVar12)) {
    local_79 = 1;
    std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)0x0,0x513944);
  }
  else {
    local_79 = (byte)tag & 1;
  }
  bVar14 = (tag & 8U) != 0;
  bVar10 = local_79;
  if (bVar14) {
    bVar10 = 1;
  }
  if (bVar14 && (bVar13 && bVar12)) {
    if (local_60 != (char *)0x0) {
      std::__cxx11::string::append((char *)&local_68);
    }
    bVar10 = 1;
    std::__cxx11::string::_M_replace((ulong)&local_68,0,local_60,0x502cd8);
  }
  bVar14 = (tag & 0x10U) == 0;
  bVar11 = 1;
  if (bVar14) {
    bVar11 = bVar10;
  }
  if (!bVar14 && (bVar13 && bVar12)) {
    if (local_60 != (char *)0x0) {
      std::__cxx11::string::append((char *)&local_68);
    }
    bVar11 = 1;
    std::__cxx11::string::_M_replace((ulong)&local_68,0,local_60,0x54a5b2);
  }
  if ((tag & 4U) == 0) {
    bVar10 = 0;
  }
  else {
    bVar10 = this->Debug;
    if ((bool)bVar10 != false) {
      bVar11 = 1;
      cVar3 = '\x01';
    }
    if ((bool)bVar10 == true && (bVar13 && bVar12)) {
      if (local_60 != (char *)0x0) {
        std::__cxx11::string::append((char *)&local_68);
      }
      bVar10 = 1;
      std::__cxx11::string::_M_replace((ulong)&local_68,0,local_60,0x4fdd10);
      cVar3 = '\x01';
      bVar11 = 1;
    }
  }
  if ((tag & 2U) == 0) {
    bVar4 = 0;
  }
  else {
    bVar4 = this->Verbose;
    bVar2 = 1;
    if ((bool)bVar4 == false) {
      bVar2 = bVar11;
    }
    bVar11 = bVar2;
    if ((bool)bVar4 == true && (bVar13 && bVar12)) {
      if (local_60 != (char *)0x0) {
        std::__cxx11::string::append((char *)&local_68);
      }
      bVar4 = 1;
      std::__cxx11::string::_M_replace((ulong)&local_68,0,local_60,0x513944);
      bVar11 = 1;
    }
  }
  bVar14 = this->Quiet;
  poVar6 = this->LogOutput;
  if (poVar6 != (ostream *)0x0) {
    if (bVar13 && bVar12) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[",1);
      pcVar1 = local_38;
      if (local_38 == (char *)0x0) {
        std::ios::clear((int)poVar6->_vptr_basic_ostream[-3] + (int)poVar6);
      }
      else {
        sVar5 = strlen(local_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar1,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,line);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_68,(long)local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
    }
    std::ostream::write((char *)this->LogOutput,(long)local_48);
  }
  this->LastTag = tag;
  if ((bVar14 != false) || (bVar11 == 0)) goto LAB_00248cf3;
  if (this->NewLine == true) {
    sVar9 = (this->ErrorPrefix)._M_string_length;
    lVar7 = 0xd8;
    if (sVar9 == 0 || (tag & 0x10U) == 0) {
      sVar9 = (this->WarningPrefix)._M_string_length;
      if (sVar9 != 0 && (tag & 8U) != 0) {
        lVar8 = 0x90;
        goto LAB_00248b78;
      }
      sVar9 = (this->OutputPrefix)._M_string_length;
      lVar7 = 0xd0;
      if ((local_79 & sVar9 != 0) != 0) {
        lVar8 = 0x30;
        goto LAB_00248b78;
      }
      sVar9 = (this->VerbosePrefix)._M_string_length;
      if ((bVar4 & sVar9 != 0) != 0) {
        lVar8 = 0x50;
        goto LAB_00248b78;
      }
      sVar9 = (this->DebugPrefix)._M_string_length;
      if ((bVar10 & sVar9 != 0) != 0) {
        lVar8 = 0x70;
        goto LAB_00248b78;
      }
      sVar9 = (this->Prefix)._M_string_length;
      lVar8 = 0x10;
      if (sVar9 != 0) goto LAB_00248b78;
    }
    else {
      lVar8 = 0xb0;
LAB_00248b78:
      std::__ostream_insert<char,std::char_traits<char>>
                (*(ostream **)((long)&(this->super_cmObject)._vptr_cmObject + lVar7),
                 *(char **)((long)&(this->super_cmObject)._vptr_cmObject + lVar8),sVar9);
    }
    pcVar1 = local_38;
    if (cVar3 != '\0') {
      if ((tag & 0x18U) == 0) {
        poVar6 = this->DefaultOutput;
        if (local_38 == (char *)0x0) {
          std::ios::clear((int)poVar6->_vptr_basic_ostream[-3] + (int)poVar6);
        }
        else {
          sVar5 = strlen(local_38);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar1,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      }
      else {
        poVar6 = this->DefaultError;
        if (local_38 == (char *)0x0) {
          std::ios::clear((int)poVar6->_vptr_basic_ostream[-3] + (int)poVar6);
        }
        else {
          sVar5 = strlen(local_38);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar1,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      }
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,line);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    }
  }
  if ((tag & 0x18U) == 0) {
    std::ostream::write((char *)this->DefaultOutput,(long)local_48);
  }
  else {
    std::ostream::write((char *)this->DefaultError,(long)local_48);
  }
  std::ostream::flush();
  if ((2 < local_40) || (local_48[local_40 - 1] == '\n')) {
    this->NewLine = true;
  }
  if ((tag & 0x10U) != 0) {
    cmSystemTools::s_ErrorOccured = true;
  }
LAB_00248cf3:
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return;
}

Assistant:

void cmCPackLog::Log(int tag, const char* file, int line,
  const char* msg, size_t length)
{
  // By default no logging
  bool display = false;

  // Display file and line number if debug
  bool useFileAndLine = this->Debug;

  bool output  = false;
  bool debug   = false;
  bool warning = false;
  bool error   = false;
  bool verbose = false;

  // When writing in file, add list of tags whenever tag changes.
  std::string tagString;
  bool needTagString = false;
  if ( this->LogOutput && this->LastTag != tag )
    {
    needTagString = true;
    }

  if ( tag & LOG_OUTPUT )
    {
    output = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "VERBOSE";
      }
    }
  if ( tag & LOG_WARNING )
    {
    warning = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "WARNING";
      }
    }
  if ( tag & LOG_ERROR )
    {
    error = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "ERROR";
      }
    }
  if ( tag & LOG_DEBUG && this->Debug )
    {
    debug = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "DEBUG";
      }
    useFileAndLine = true;
    }
  if ( tag & LOG_VERBOSE && this->Verbose )
    {
    verbose = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "VERBOSE";
      }
    }
  if ( this->Quiet )
    {
    display = false;
    }
  if ( this->LogOutput )
    {
    if ( needTagString )
      {
      *this->LogOutput << "[" << file << ":" << line << " "
        << tagString << "] ";
      }
    this->LogOutput->write(msg, length);
    }
  this->LastTag = tag;
  if ( !display )
    {
    return;
    }
  if ( this->NewLine )
    {
    if ( error && !this->ErrorPrefix.empty() )
      {
      *this->DefaultError << this->ErrorPrefix;
      }
    else if ( warning && !this->WarningPrefix.empty() )
      {
      *this->DefaultError << this->WarningPrefix;
      }
    else if ( output && !this->OutputPrefix.empty() )
      {
      *this->DefaultOutput << this->OutputPrefix;
      }
    else if ( verbose && !this->VerbosePrefix.empty() )
      {
      *this->DefaultOutput << this->VerbosePrefix;
      }
    else if ( debug && !this->DebugPrefix.empty() )
      {
      *this->DefaultOutput << this->DebugPrefix;
      }
    else if ( !this->Prefix.empty() )
      {
      *this->DefaultOutput << this->Prefix;
      }
    if ( useFileAndLine )
      {
      if ( error || warning )
        {
        *this->DefaultError << file << ":" << line << " ";
        }
      else
        {
        *this->DefaultOutput << file << ":" << line << " ";
        }
      }
    }
  if ( error || warning )
    {
    this->DefaultError->write(msg, length);
    this->DefaultError->flush();
    }
  else
    {
    this->DefaultOutput->write(msg, length);
    this->DefaultOutput->flush();
    }
  if ( msg[length-1] == '\n' || length > 2 )
    {
    this->NewLine = true;
    }

  if ( error )
    {
    cmSystemTools::SetErrorOccured();
    }
}